

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall tinyusdz::Attribute::is_connection(Attribute *this)

{
  bool bVar1;
  size_type sVar2;
  Attribute *this_local;
  
  bVar1 = has_timesamples(this);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = has_blocked(this);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = has_value(this);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        sVar2 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(&this->_paths);
        this_local._7_1_ = sVar2 != 0;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool is_connection() const {
    if (has_timesamples()) {
      return false;
    }

    if (has_blocked()) {
      return false;
    }

    if (has_value()) {
      return false;
    }

    return _paths.size() > 0;
  }